

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

QList<std::pair<double,_QPointF>_> * __thiscall
QGraphicsItemAnimation::posList(QGraphicsItemAnimation *this)

{
  qsizetype qVar1;
  const_reference pPVar2;
  long in_RSI;
  QList<std::pair<double,_QPointF>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  int i;
  int xPosCount;
  QList<std::pair<double,_QPointF>_> *list;
  double *in_stack_ffffffffffffff98;
  QList<std::pair<double,_QPointF>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (pair<double,_QPointF> *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<double,_QPointF>_>::QList((QList<std::pair<double,_QPointF>_> *)0xa61431);
  qVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::size
                    ((QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(in_RSI + 0x10) + 0x88)
                    );
  QList<std::pair<double,_QPointF>_>::reserve
            ((QList<std::pair<double,_QPointF>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_stack_00000008);
  for (iVar3 = 0; iVar3 < (int)qVar1; iVar3 = iVar3 + 1) {
    QList<QGraphicsItemAnimationPrivate::Pair>::at
              ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffffa0,
               (qsizetype)in_stack_ffffffffffffff98);
    pPVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::at
                       ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffffa0,
                        (qsizetype)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa0 = (QList<std::pair<double,_QPointF>_> *)pPVar2->value;
    pPVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::at
                       ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffffa0,
                        (qsizetype)in_stack_ffffffffffffff98);
    QPointF::QPointF(&local_18,(qreal)in_stack_ffffffffffffffa0,pPVar2->value);
    QList<std::pair<double,QPointF>>::emplace_back<double_const&,QPointF>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(QPointF *)0xa614fc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<std::pair<qreal, QPointF> > QGraphicsItemAnimation::posList() const
{
    QList<std::pair<qreal, QPointF>> list;
    const int xPosCount = d->xPosition.size();
    list.reserve(xPosCount);
    for (int i = 0; i < xPosCount; ++i)
        list.emplace_back(d->xPosition.at(i).step,
                          QPointF(d->xPosition.at(i).value, d->yPosition.at(i).value));

    return list;
}